

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_function_prototype
          (CompilerHLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint uVar1;
  ExecutionModel EVar2;
  size_t sVar3;
  Variant *pVVar4;
  bool bVar5;
  int iVar6;
  SPIREntryPoint *pSVar7;
  SPIRType *pSVar8;
  ulong uVar9;
  SPIRVariable *pSVar10;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  Parameter *arg;
  long lVar13;
  Parameter *pPVar14;
  string decl;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  string out_argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b0;
  string local_1290;
  SPIRFunction *local_1270;
  char *local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  undefined1 local_1240 [280];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  pSVar7 = Compiler::get_entry_point((Compiler *)this);
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&(this->super_CompilerGLSL).local_variable_names,
             &(this->super_CompilerGLSL).resource_names._M_h);
  local_12b0._M_dataplus._M_p = (pointer)&local_12b0.field_2;
  local_12b0._M_string_length = 0;
  local_12b0.field_2._M_local_buf[0] = '\0';
  local_1270 = func;
  pSVar8 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(func->super_IVariant).field_0xc);
  if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    CompilerGLSL::flags_to_qualifiers_glsl(&this->super_CompilerGLSL,pSVar8,return_flags);
    ::std::__cxx11::string::append((char *)&local_12b0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1128,this,pSVar8,0);
    ::std::__cxx11::string::_M_append((char *)&local_12b0,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    ::std::__cxx11::string::append((char *)&local_12b0);
  }
  else {
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_12b0,0,(char *)local_12b0._M_string_length,0x2e387c);
  }
  uVar1 = (local_1270->super_IVariant).self.id;
  if (uVar1 == (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    EVar2 = pSVar7->model;
    if (((EVar2 != ExecutionModelVertex) && (EVar2 != ExecutionModelGLCompute)) &&
       (EVar2 != ExecutionModelFragment)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1128._0_8_ = local_1128 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"Unsupported execution model.","");
      ::std::runtime_error::runtime_error(this_00,(string *)local_1128);
      *(undefined ***)this_00 = &PTR__runtime_error_00357118;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)&local_12b0);
    (this->super_CompilerGLSL).processing_entry_point = true;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_1128,this,(ulong)uVar1,1);
    ::std::__cxx11::string::_M_append((char *)&local_12b0,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  ::std::__cxx11::string::append((char *)&local_12b0);
  local_1240._0_8_ = local_1240 + 0x18;
  local_1240._8_8_ = 0;
  local_1240._16_8_ = 8;
  if ((pSVar8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    local_1128._8_8_ = 0;
    local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
    local_1128._0_8_ = local_1128 + 0x10;
    ::std::__cxx11::string::append(local_1128);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1290,this,pSVar8,0);
    ::std::__cxx11::string::_M_append(local_1128,(ulong)local_1290._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
      operator_delete(local_1290._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append(local_1128);
    ::std::__cxx11::string::append(local_1128);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_1290,this,pSVar8);
    ::std::__cxx11::string::_M_append(local_1128,(ulong)local_1290._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
      operator_delete(local_1290._M_dataplus._M_p);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1240,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  sVar3 = (local_1270->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
  ;
  if (sVar3 != 0) {
    pPVar14 = (local_1270->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar13 = sVar3 * 0x14;
    do {
      iVar6 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x2f])
                        (this,(ulong)(pPVar14->id).id);
      if ((char)iVar6 == '\0') {
        CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar14->id).id);
        CompilerGLSL::argument_decl_abi_cxx11_
                  ((string *)local_1128,&this->super_CompilerGLSL,pPVar14);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1240,(string *)local_1128);
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        pSVar8 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (pPVar14->type).id);
        if (((0x1e < *(uint *)&(this->super_CompilerGLSL).field_0x241c) &&
            (*(int *)&(pSVar8->super_IVariant).field_0xc == 0x11)) &&
           ((pSVar8->image).dim != DimBuffer)) {
          bVar5 = Compiler::image_is_comparison((Compiler *)this,pSVar8,(pPVar14->id).id);
          local_1268 = "SamplerState ";
          if (bVar5) {
            local_1268 = "SamplerComparisonState ";
          }
          to_sampler_expression_abi_cxx11_(&local_1290,this,(pPVar14->id).id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_1260,this,pSVar8)
          ;
          join<char_const*,std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_1128,(spirv_cross *)&local_1268,(char **)&local_1290,
                     &local_1260,in_R8);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1240,(string *)local_1128);
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
            operator_delete((void *)local_1128._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
            operator_delete(local_1260._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
            operator_delete(local_1290._M_dataplus._M_p);
          }
        }
        uVar9 = (ulong)(pPVar14->id).id;
        if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.buffer_size) &&
           (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar9].type == TypeVariable)
           ) {
          pSVar10 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
          pSVar10->parameter = pPVar14;
        }
      }
      pPVar14 = pPVar14 + 1;
      lVar13 = lVar13 + -0x14;
    } while (lVar13 != 0);
  }
  sVar3 = (local_1270->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  if (sVar3 != 0) {
    pPVar14 = (local_1270->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              ptr;
    lVar13 = sVar3 * 0x14;
    do {
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,(pPVar14->id).id);
      CompilerGLSL::argument_decl_abi_cxx11_((string *)local_1128,&this->super_CompilerGLSL,pPVar14)
      ;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,(string *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar9 = (ulong)(pPVar14->id).id;
      if ((uVar9 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar4[uVar9].type == TypeVariable))
      {
        pSVar10 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        pSVar10->parameter = pPVar14;
      }
      pPVar14 = pPVar14 + 1;
      lVar13 = lVar13 + -0x14;
    } while (lVar13 != 0);
  }
  local_110 = local_f8;
  local_1128._16_8_ = 0;
  local_1128._0_8_ = (pointer)0x0;
  local_1128._8_8_ = 0;
  local_108 = 0;
  local_100 = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  if (local_1240._8_8_ != 0) {
    pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1240._0_8_ + local_1240._8_8_ * 0x20);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar12->_M_dataplus)._M_p,
                 pbVar12->_M_string_length);
      if (pbVar12 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_1240._0_8_ + (local_1240._8_8_ - 1) * 0x20)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar11);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1290,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  ::std::__cxx11::string::_M_append((char *)&local_12b0,(ulong)local_1290._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
    operator_delete(local_1290._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_12b0);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_12b0);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b0._M_dataplus._M_p != &local_12b0.field_2) {
    operator_delete(local_12b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	auto &execution = get_entry_point();
	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	if (type.array.empty())
	{
		decl += flags_to_qualifiers_glsl(type, return_flags);
		decl += type_to_glsl(type);
		decl += " ";
	}
	else
	{
		// We cannot return arrays in HLSL, so "return" through an out variable.
		decl = "void ";
	}

	if (func.self == ir.default_entry_point)
	{
		if (execution.model == ExecutionModelVertex)
			decl += "vert_main";
		else if (execution.model == ExecutionModelFragment)
			decl += "frag_main";
		else if (execution.model == ExecutionModelGLCompute)
			decl += "comp_main";
		else
			SPIRV_CROSS_THROW("Unsupported execution model.");
		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;

	if (!type.array.empty())
	{
		// Fake array returns by writing to an out array instead.
		string out_argument;
		out_argument += "out ";
		out_argument += type_to_glsl(type);
		out_argument += " ";
		out_argument += "SPIRV_Cross_return_value";
		out_argument += type_to_array_glsl(type);
		arglist.push_back(move(out_argument));
	}

	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Flatten a combined sampler to two separate arguments in modern HLSL.
		auto &arg_type = get<SPIRType>(arg.type);
		if (hlsl_options.shader_model > 30 && arg_type.basetype == SPIRType::SampledImage &&
		    arg_type.image.dim != DimBuffer)
		{
			// Manufacture automatic sampler arg for SampledImage texture
			arglist.push_back(join(image_is_comparison(arg_type, arg.id) ? "SamplerComparisonState " : "SamplerState ",
			                       to_sampler_expression(arg.id), type_to_array_glsl(arg_type)));
		}

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}